

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamRandomAccessController::~BamRandomAccessController
          (BamRandomAccessController *this)

{
  Close(this);
  std::__cxx11::string::~string((string *)&this->m_errorString);
  return;
}

Assistant:

BamRandomAccessController::~BamRandomAccessController(void) {
    Close();
}